

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow **ppIVar4;
  int i;
  ImRect local_40;
  
  pIVar1 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar3 = GImGui->NavWindow, pIVar3 == (ImGuiWindow *)0x0 || (pIVar3->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if ((pIVar3 != (ImGuiWindow *)0x0) &&
           (pIVar3 = GetTopMostPopupModal(), pIVar3 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else {
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if (((pIVar1->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
           ((pIVar1->HoveredRootWindow->Flags & 1) == 0)) {
          local_40 = ImGuiWindow::TitleBarRect(pIVar1->HoveredRootWindow);
          bVar2 = ImRect::Contains(&local_40,(pIVar1->IO).MouseClickedPos);
          if (!bVar2) {
            pIVar1->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if ((pIVar1->IO).MouseClicked[1] == true) {
      pIVar3 = GetTopMostPopupModal();
      i = (pIVar1->Windows).Size;
      bVar2 = pIVar3 == (ImGuiWindow *)0x0;
      while ((0 < i && (!bVar2))) {
        i = i + -1;
        ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i);
        if (*ppIVar4 == pIVar3) break;
        if (*ppIVar4 == pIVar1->HoveredWindow) {
          bVar2 = true;
        }
      }
      if (bVar2) {
        pIVar3 = pIVar1->HoveredWindow;
      }
      ClosePopupsOverWindow(pIVar3,true);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}